

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetGameHighScore(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar2;
  iterator iVar3;
  optional<int> oVar4;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  path_type *data_00;
  Ptr PVar6;
  path_type local_88;
  type local_58;
  
  data_00 = &local_88;
  puVar2 = (undefined8 *)operator_new(0x48);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_002a5540;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[8] = 0;
  puVar2[2] = puVar2 + 4;
  puVar2[3] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  *(undefined8 **)(this + 8) = puVar2;
  *(string **)this = (string *)(puVar2 + 2);
  paVar1 = &local_88.m_value.field_2;
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"position","");
  local_88.m_separator = '.';
  local_88.m_start._M_current = local_88.m_value._M_dataplus._M_p;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_58,in_RDX,&local_88,"");
  std::__cxx11::string::operator=((string *)(puVar2 + 2),(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
      &local_58.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"user","");
  iVar3 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_88.m_value);
  if (iVar3.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_58._M_dataplus._M_p._0_4_ = 0;
    local_58._M_dataplus._M_p._4_4_ = 0;
    local_58._M_string_length._0_4_ = 0;
    local_58._M_string_length._4_4_ = 0;
  }
  else {
    parseJsonAndGetUser((TgTypeParser *)&local_58,(ptree *)data_00);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[7];
  *(undefined4 *)(puVar2 + 6) = local_58._M_dataplus._M_p._0_4_;
  *(undefined4 *)((long)puVar2 + 0x34) = local_58._M_dataplus._M_p._4_4_;
  *(undefined4 *)(puVar2 + 7) = (undefined4)local_58._M_string_length;
  *(undefined4 *)((long)puVar2 + 0x3c) = local_58._M_string_length._4_4_;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
  }
  local_88.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"score","");
  local_88.m_separator = '.';
  local_88.m_start._M_current = local_88.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_88);
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)oVar4.super_type >> 0x20);
  }
  *(int *)(puVar2 + 8) = (int)_Var5._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.m_value._M_dataplus._M_p);
    _Var5._M_pi = extraout_RDX;
  }
  PVar6.super___shared_ptr<TgBot::GameHighScore,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<TgBot::GameHighScore,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar6.super___shared_ptr<TgBot::GameHighScore,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

GameHighScore::Ptr TgTypeParser::parseJsonAndGetGameHighScore(const ptree& data) const {
    auto result(make_shared<GameHighScore>());
    result->position = data.get("position", "");
    result->user = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "user");
    result->score = data.get<int32_t>("score", 0);
    return result;
}